

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

bool __thiscall QCalendarPopup::event(QCalendarPopup *this,QEvent *event)

{
  char cVar1;
  bool bVar2;
  QKeyEvent *keyEvent;
  
  if (*(short *)(event + 8) == 6) {
    cVar1 = QKeyEvent::matches((StandardKey)event);
    if (cVar1 != '\0') {
      this->dateChanged = false;
    }
  }
  bVar2 = QWidget::event(&this->super_QWidget,event);
  return bVar2;
}

Assistant:

bool QCalendarPopup::event(QEvent *event)
{
#if QT_CONFIG(shortcut)
    if (event->type() == QEvent::KeyPress) {
        QKeyEvent *keyEvent = static_cast<QKeyEvent*>(event);
        if (keyEvent->matches(QKeySequence::Cancel))
            dateChanged = false;
    }
#endif
    return QWidget::event(event);
}